

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulated_vectorization.cpp
# Opt level: O0

Vector4d * operator+(Vector4d *v1,Vector4d *v2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double *in_RDX;
  double *in_RSI;
  Vector4d *in_RDI;
  __m256d data3;
  __m256d data2;
  __m256d data1;
  
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[3];
  dVar5 = *in_RDX;
  dVar6 = in_RDX[1];
  dVar7 = in_RDX[2];
  dVar8 = in_RDX[3];
  Vector4d::Vector4d(in_RDI);
  in_RDI->data[0] = dVar1 + dVar5;
  in_RDI->data[1] = dVar2 + dVar6;
  in_RDI->data[2] = dVar3 + dVar7;
  in_RDI->data[3] = dVar4 + dVar8;
  return in_RDI;
}

Assistant:

Vector4d operator+ (const Vector4d& v1, const Vector4d& v2) {
  __m256d data1 = _mm256_load_pd(v1.data);
  __m256d data2 = _mm256_load_pd(v2.data);
  __m256d data3 = _mm256_add_pd(data1, data2);
  Vector4d result;
  _mm256_store_pd(result.data, data3);
  return result;
}